

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_bidiagonalize<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *mat_b,double *mat_v,
               double *epsilon)

{
  size_t __n;
  size_t __n_00;
  undefined1 auVar1 [8];
  double *mat_res;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int length;
  long lVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  double *pdVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  double dVar25;
  undefined1 local_1c8 [8];
  vector<double,_std::allocator<double>_> buffer;
  double house_beta;
  undefined1 local_178 [8];
  vector<double,_std::allocator<double>_> buffer2;
  double inner_house_beta;
  double *local_130;
  long local_128;
  long local_120;
  ulong local_110;
  double local_e0;
  ulong local_d8;
  ulong local_d0;
  double *local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  double *local_a0;
  ulong local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  long local_78;
  uint local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  long local_58;
  ulong local_50;
  double *local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000034,rows);
  local_38 = CONCAT44(in_register_00000014,cols);
  local_a0 = mat_u;
  local_88 = mat_v;
  if (rows != 0) {
    lVar23 = 0;
    memset(mat_u,0,(ulong)(uint)(rows * rows) * 8);
    do {
      local_a0[lVar23] = 1.0;
      lVar23 = lVar23 + (rows + 1);
    } while (lVar23 < rows * rows);
  }
  iVar2 = (int)local_38;
  if ((int)local_38 != 0) {
    uVar20 = (int)local_38 * (int)local_38;
    lVar23 = 0;
    memset(local_88,0,(ulong)uVar20 * 8);
    do {
      local_88[lVar23] = 1.0;
      lVar23 = lVar23 + (iVar2 + 1);
    } while (lVar23 < (int)uVar20);
  }
  iVar2 = (int)local_38 * (int)local_40;
  if (iVar2 != 0) {
    memmove(mat_b,mat_a,(long)iVar2 << 3);
  }
  iVar2 = (int)local_38;
  uVar20 = iVar2 - (uint)((int)local_40 == iVar2);
  if (0 < (int)uVar20) {
    uVar10 = (int)local_40 * (int)local_40;
    uVar16 = iVar2 * iVar2;
    lVar23 = (long)iVar2;
    lVar18 = (long)(int)local_40;
    local_120 = lVar18 << 4;
    iVar19 = iVar2 + -1;
    local_b0 = lVar23 * 0x10;
    local_64 = (int)local_40 * iVar19;
    iVar13 = (2 - iVar2) - (int)local_40;
    iVar22 = iVar2 * -2 + 3;
    local_48 = (double *)CONCAT44(local_48._4_4_,iVar19);
    local_6c = iVar19 * iVar19;
    uVar3 = (int)local_40 + 1;
    __n = (ulong)uVar10 * 8;
    local_110 = (ulong)(iVar2 + 1);
    __n_00 = (ulong)uVar16 * 8;
    uVar4 = local_40 & 0xffffffff;
    local_d8 = local_38 & 0xffffffff;
    local_130 = mat_b + lVar23;
    local_128 = lVar18 * 8;
    inner_house_beta = (double)(lVar23 * 8);
    local_78 = 1;
    local_c0 = 0;
    local_b8 = 1;
    local_c8 = mat_b;
    local_60 = 0;
    local_50 = local_d8;
    uVar24 = local_40;
    local_a8 = local_110;
    do {
      local_b0 = local_b0 + -0x10;
      inner_house_beta = (double)((long)inner_house_beta + -8);
      uVar9 = uVar24 & 0xffffffff;
      lVar15 = lVar18 - local_60;
      iVar19 = (int)lVar15;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_1c8,
                 (long)(int)((iVar19 + 2) * iVar19 + uVar10 * 2),(allocator_type *)local_178);
      auVar1 = local_1c8;
      if (0 < lVar15) {
        uVar8 = 0;
        pdVar5 = local_c8;
        do {
          *(double *)((long)local_1c8 + uVar8 * 8) = *pdVar5;
          uVar8 = uVar8 + 1;
          pdVar5 = pdVar5 + lVar23;
        } while (uVar9 != uVar8);
      }
      pdVar5 = (double *)((long)local_1c8 + lVar15 * 8);
      local_80 = pdVar5 + lVar15;
      local_178 = (undefined1  [8])&DAT_3ff0000000000000;
      matrix_householder_vector<double>
                ((double *)local_1c8,iVar19,pdVar5,
                 (double *)
                 &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,epsilon,(double *)local_178);
      pdVar17 = local_80;
      local_58 = lVar15;
      matrix_householder_matrix<double>
                (pdVar5,iVar19,
                 (double)buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_80);
      iVar19 = (int)local_60;
      matrix_apply_householder_matrix<double>
                (mat_b,(int)local_40,(int)local_38,pdVar17,(int)local_40 - iVar19,iVar19,iVar19);
      local_d0 = local_60 + 1;
      uVar8 = uVar4;
      pdVar5 = local_130;
      if ((long)local_d0 < lVar18) {
        do {
          *pdVar5 = 0.0;
          pdVar5 = pdVar5 + lVar23;
          uVar8 = uVar8 - 1;
        } while (local_b8 != uVar8);
      }
      pdVar17 = pdVar17 + (uint)((int)local_58 * (int)local_58);
      if ((int)local_40 != 0) {
        memset(pdVar17,0,__n);
      }
      pdVar5 = local_a0;
      if (local_60 != 0) {
        iVar19 = 0;
        uVar8 = local_60;
        do {
          pdVar17[iVar19] = 1.0;
          iVar19 = iVar19 + uVar3;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      if (0 < local_58) {
        lVar21 = (long)auVar1 + local_120;
        uVar8 = 0;
        lVar15 = local_c0;
        do {
          uVar12 = 0;
          do {
            pdVar17[(int)lVar15 + (int)uVar12] = *(double *)(lVar21 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
          uVar8 = uVar8 + 1;
          lVar21 = lVar21 + local_128;
          lVar15 = lVar15 + uVar4;
        } while (uVar8 != uVar9);
      }
      if ((int)local_40 != 0) {
        memmove(pdVar17 + uVar10,local_a0,__n);
      }
      iVar19 = (int)local_40;
      matrix_multiply<double>(pdVar17 + uVar10,iVar19,iVar19,pdVar17,iVar19,pdVar5);
      iVar19 = (int)local_48;
      uVar8 = (ulong)local_48 & 0xffffffff;
      local_80 = (double *)(local_50 - 1);
      if ((long)local_60 <= (long)(iVar2 + -3)) {
        local_e0 = 0.0;
        dVar25 = 0.0;
        uVar12 = lVar23 - local_d0;
        if (uVar12 != 0 && (long)local_d0 <= lVar23) {
          uVar6 = 1;
          do {
            dVar25 = dVar25 + local_c8[uVar6];
            uVar6 = uVar6 + 1;
            local_e0 = dVar25;
          } while (local_50 != uVar6);
        }
        if ((0.0 - *epsilon <= local_e0) && (local_e0 <= *epsilon)) {
          local_e0 = 1.0;
        }
        iVar14 = ~(uint)local_60 + (int)local_38;
        uVar11 = iVar14 * (int)local_58;
        local_98 = (ulong)uVar11;
        local_50 = uVar12;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_178,
                   (long)(int)(((int)uVar12 + 2) * (int)uVar12 + (uVar16 + uVar11) * 2),
                   (allocator_type *)
                   &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        auVar1 = local_178;
        if (0 < iVar14) {
          uVar12 = 0;
          do {
            *(double *)((long)local_178 + uVar12 * 8) = mat_b[(int)local_78 + (int)uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
        local_90 = (double *)((long)local_178 + local_50 * 8);
        pdVar5 = local_90 + local_50;
        length = (int)local_50;
        local_68 = iVar14;
        matrix_householder_vector<double>
                  ((double *)local_178,length,local_90,
                   (double *)
                   &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,epsilon,&local_e0);
        matrix_householder_matrix<double>
                  (local_90,length,
                   (double)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,pdVar5);
        lVar15 = local_b0 + (ulong)local_6c * 8;
        local_48 = (double *)((long)(int)local_48 * 8);
        if (0 < local_58) {
          lVar7 = lVar15 + (long)local_64 * 8 + (long)auVar1;
          uVar12 = 0;
          lVar21 = local_78;
          do {
            if (0 < local_68) {
              uVar6 = 0;
              do {
                *(double *)(lVar7 + uVar6 * 8) = mat_b[(int)lVar21 + (int)uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar8 != uVar6);
            }
            uVar12 = uVar12 + 1;
            lVar7 = lVar7 + (long)local_48;
            lVar21 = lVar21 + local_d8;
          } while (uVar12 != uVar9);
        }
        local_98 = (ulong)(int)local_98;
        local_90 = pdVar5 + (uint)((int)local_50 * (int)local_50) + local_98;
        matrix_multiply<double>
                  (local_90,(int)local_58,local_68,pdVar5,(int)local_38 - (int)local_d0,
                   pdVar5 + (uint)((int)local_50 * (int)local_50));
        if (0 < local_58) {
          lVar15 = lVar15 + (long)auVar1;
          uVar12 = 0;
          lVar21 = local_78;
          do {
            if (0 < local_68) {
              uVar6 = 0;
              do {
                mat_b[(int)lVar21 + (int)uVar6] = *(double *)(lVar15 + uVar6 * 8);
                uVar6 = uVar6 + 1;
              } while (uVar8 != uVar6);
            }
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + (long)local_48;
            lVar21 = lVar21 + local_d8;
          } while (uVar12 != uVar9);
        }
        if ((long)local_60 < lVar23 + -2) {
          memset(mat_b + ((int)local_a8 * (int)local_60 + 2),0,
                 (ulong)(uint)((iVar2 + -3) - (int)local_60) * 8 + 8);
        }
        pdVar5 = local_90 + local_98;
        if ((int)local_38 != 0) {
          memset(pdVar5,0,__n_00);
        }
        mat_res = local_88;
        pdVar17 = pdVar5 + uVar16;
        iVar14 = 0;
        uVar9 = local_b8;
        do {
          pdVar5[iVar14] = 1.0;
          iVar14 = iVar14 + (int)local_a8;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        if (0 < (long)local_50) {
          lVar15 = (long)auVar1 + local_b0;
          uVar12 = 0;
          uVar9 = local_110;
          do {
            uVar6 = 0;
            do {
              pdVar5[(int)uVar9 + (int)uVar6] = *(double *)(lVar15 + uVar6 * 8);
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + (long)inner_house_beta;
            uVar9 = uVar9 + local_d8;
          } while (uVar12 != ((ulong)local_80 & 0xffffffff));
        }
        if ((int)local_38 != 0) {
          local_48 = pdVar17;
          memmove(pdVar17,local_88,__n_00);
          pdVar17 = local_48;
        }
        iVar14 = (int)local_38;
        matrix_multiply<double>(pdVar17,iVar14,iVar14,pdVar5,iVar14,mat_res);
        if (local_178 != (undefined1  [8])0x0) {
          operator_delete((void *)local_178);
        }
      }
      if (local_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1c8);
      }
      uVar24 = (ulong)((int)uVar24 - 1);
      local_b8 = local_b8 + 1;
      local_c8 = local_c8 + lVar23 + 1;
      local_130 = local_130 + lVar23 + 1;
      local_120 = local_120 + -0x10;
      local_128 = local_128 + -8;
      local_c0 = local_c0 + (ulong)uVar3;
      local_78 = local_78 + local_a8;
      local_64 = local_64 + iVar13;
      iVar13 = iVar13 + 2;
      local_6c = local_6c + iVar22;
      iVar22 = iVar22 + 2;
      local_110 = local_110 + local_a8;
      local_48 = (double *)CONCAT44(local_48._4_4_,iVar19 + -1);
      local_60 = local_d0;
      local_50 = (ulong)local_80;
    } while (local_d0 != uVar20);
  }
  return;
}

Assistant:

void
matrix_bidiagonalize (T const* mat_a, int rows, int cols, T* mat_u,
    T* mat_b, T* mat_v, T const& epsilon)
{
    /* Initialize U and V with identity matrices. */
    matrix_set_identity(mat_u, rows);
    matrix_set_identity(mat_v, cols);

    /* Copy mat_a into mat_b. */
    std::copy(mat_a, mat_a + rows * cols, mat_b);

    int const steps = (rows == cols) ? (cols - 1) : cols;
    for (int k = 0; k < steps; ++k)
    {
        int const sub_length = rows - k;
        std::vector<T> buffer(sub_length // input_vec
            + sub_length // house_vec
            + sub_length * sub_length // house_mat
            + rows * rows // update_u
            + rows * rows); // mat_u_tmp
        T* input_vec = &buffer[0];
        T* house_vec = input_vec + sub_length;
        T* house_mat = house_vec + sub_length;
        T house_beta;
        T* update_u = house_mat + sub_length * sub_length;
        T* mat_u_tmp = update_u + rows * rows;

        for (int i = 0; i < sub_length; ++i)
            input_vec[i] = mat_b[(k + i) * cols + k];

        matrix_householder_vector(input_vec, sub_length, house_vec,
            &house_beta, epsilon, T(1));
        matrix_householder_matrix(house_vec, sub_length,
            house_beta, house_mat);
        matrix_apply_householder_matrix(mat_b, rows, cols,
            house_mat, sub_length, k, k);

        for (int i = k + 1; i < rows; ++i)
            mat_b[i * cols + k] = T(0);

        /* Construct U update matrix and update U. */
        std::fill(update_u, update_u + rows * rows, T(0));
        for (int i = 0; i < k; ++i)
            update_u[i * rows + i] = T(1);
        for (int i = 0; i < sub_length; ++i)
        {
            for (int j = 0; j < sub_length; ++j)
            {
                update_u[(k + i) * rows + (k + j)] =
                    house_mat[i * sub_length + j];
            }
        }

        /* Copy matrix U for multiplication. */
        std::copy(mat_u, mat_u + rows * rows, mat_u_tmp);
        matrix_multiply(mat_u_tmp, rows, rows, update_u, rows, mat_u);

        if (k <= cols - 3)
        {
            /* Normalization constant for numerical stability. */
            T norm(0);
            for (int i = k + 1; i < cols; ++i)
                norm += mat_b[k * cols + i];
            if (MATH_EPSILON_EQ(norm, T(0), epsilon))
                norm = T(1);

            int const inner_sub_length = cols - (k + 1);
            int const slice_rows = rows - k;
            int const slice_cols = cols - k - 1;
            std::vector<T> buffer2(inner_sub_length // inner_input_vec
                + inner_sub_length // inner_house_vec
                + inner_sub_length * inner_sub_length // inner_house_mat
                + slice_rows * slice_cols // mat_b_res
                + slice_rows * slice_cols // mat_b_tmp
                + cols * cols // update_v
                + cols * cols); // mat_v_tmp

            T* inner_input_vec = &buffer2[0];
            T* inner_house_vec = inner_input_vec + inner_sub_length;
            T* inner_house_mat = inner_house_vec + inner_sub_length;
            T inner_house_beta;
            T* mat_b_res = inner_house_mat  + inner_sub_length * inner_sub_length;
            T* mat_b_tmp = mat_b_res + slice_rows * slice_cols;
            T* update_v = mat_b_tmp + slice_rows * slice_cols;
            T* mat_v_tmp = update_v + cols * cols;

            for (int i = 0; i < cols - k - 1; ++i)
                inner_input_vec[i] = mat_b[k * cols + (k + 1 + i)];

            matrix_householder_vector(inner_input_vec, inner_sub_length,
                inner_house_vec, &inner_house_beta, epsilon, norm);
            matrix_householder_matrix(inner_house_vec, inner_sub_length,
                inner_house_beta, inner_house_mat);

            /* Cut out mat_b(k:m, (k+1):n). */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b_tmp[i * slice_cols + j] =
                        mat_b[(k + i) * cols + (k + 1 + j)];
                }
            }
            matrix_multiply(mat_b_tmp, slice_rows, slice_cols,
                inner_house_mat, inner_sub_length, mat_b_res);

            /* Write frame back into mat_b. */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b[(k + i) * cols + (k + 1 + j)] =
                        mat_b_res[i * slice_cols + j];
                }
            }

            for (int i = k + 2; i < cols; ++i)
                mat_b[k * cols + i] = T(0);

            std::fill(update_v, update_v + cols * cols, T(0));
            for (int i = 0; i < k + 1; ++i)
                update_v[i * cols + i] = T(1);
            for (int i = 0; i < inner_sub_length; ++i)
            {
                for (int j = 0; j < inner_sub_length; ++j)
                {
                    update_v[(k + i + 1) * cols + (k + j + 1)] =
                        inner_house_mat[i * inner_sub_length + j];
                }
            }

            /* Copy matrix v for multiplication. */
            std::copy(mat_v, mat_v + cols * cols, mat_v_tmp);
            matrix_multiply(mat_v_tmp, cols, cols, update_v, cols, mat_v);
        }
    }
}